

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes3InfoTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::QueryStringCase::iterate(QueryStringCase *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1a0;
  char *local_20;
  char *result;
  Functions *gl;
  QueryStringCase *this_local;
  
  gl = (Functions *)this;
  pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  result = (char *)CONCAT44(extraout_var,iVar1);
  local_20 = (char *)(**(code **)(result + 0xa78))(this->m_query);
  err = (**(code **)(result + 0x800))();
  glu::checkError(err,"glGetString() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/tes3InfoTests.cpp"
                  ,0x3b);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_1a0,&local_20);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		const char*				result	= (const char*)gl.getString(m_query);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString() failed");

		m_testCtx.getLog() << tcu::TestLog::Message << result << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}